

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecStr.h
# Opt level: O0

void Vec_StrPrintNum(Vec_Str_t *p,int Num)

{
  char acStack_28 [8];
  char Digits [16];
  int i;
  int Num_local;
  Vec_Str_t *p_local;
  
  Digits._12_4_ = Num;
  if (Num == 0) {
    Vec_StrPush(p,'0');
  }
  else {
    if (Num < 0) {
      Vec_StrPush(p,'-');
      Digits._12_4_ = -Digits._12_4_;
    }
    Digits[8] = '\0';
    Digits[9] = '\0';
    Digits[10] = '\0';
    Digits[0xb] = '\0';
    for (; Digits._12_4_ != 0; Digits._12_4_ = (int)Digits._12_4_ / 10) {
      acStack_28[(int)Digits._8_4_] = (char)((int)Digits._12_4_ % 10);
      Digits._8_4_ = Digits._8_4_ + 1;
    }
    for (Digits._8_4_ = Digits._8_4_ + -1; -1 < (int)Digits._8_4_; Digits._8_4_ = Digits._8_4_ + -1)
    {
      Vec_StrPush(p,acStack_28[(int)Digits._8_4_] + '0');
    }
  }
  return;
}

Assistant:

static inline void Vec_StrPrintNum( Vec_Str_t * p, int Num )
{
    int i;
    char Digits[16];
    if ( Num == 0 )
    {
        Vec_StrPush( p, '0' );
        return;
    }
    if ( Num < 0 )
    {
        Vec_StrPush( p, '-' );
        Num = -Num;
    }
    for ( i = 0; Num; Num /= 10,  i++ )
        Digits[i] = Num % 10;
    for ( i--; i >= 0; i-- )
        Vec_StrPush( p, (char)('0' + Digits[i]) );
}